

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameColumnIdlistNames(Parse *pParse,RenameCtx *pCtx,IdList *pIdList,char *zOld)

{
  char *zLeft;
  int iVar1;
  char *zName;
  int i;
  char *zOld_local;
  IdList *pIdList_local;
  RenameCtx *pCtx_local;
  Parse *pParse_local;
  
  if (pIdList != (IdList *)0x0) {
    for (zName._4_4_ = 0; zName._4_4_ < pIdList->nId; zName._4_4_ = zName._4_4_ + 1) {
      zLeft = pIdList->a[zName._4_4_].zName;
      iVar1 = sqlite3_stricmp(zLeft,zOld);
      if (iVar1 == 0) {
        renameTokenFind(pParse,pCtx,zLeft);
      }
    }
  }
  return;
}

Assistant:

static void renameColumnIdlistNames(
  Parse *pParse, 
  RenameCtx *pCtx, 
  IdList *pIdList, 
  const char *zOld
){
  if( pIdList ){
    int i;
    for(i=0; i<pIdList->nId; i++){
      char *zName = pIdList->a[i].zName;
      if( 0==sqlite3_stricmp(zName, zOld) ){
        renameTokenFind(pParse, pCtx, (void*)zName);
      }
    }
  }
}